

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

Dict * tagsLookup(TidyDocImpl *doc,TidyTagImpl *tags,ctmbstr s)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  DictHash *pDVar5;
  Dict *old;
  ulong uVar6;
  long *in_FS_OFFSET;
  
  if (s != (ctmbstr)0x0) {
    cVar4 = *s;
    uVar6 = 0;
    if (cVar4 != '\0') {
      pcVar3 = s + 1;
      do {
        uVar1 = (int)uVar6 * 0x1f + (int)cVar4;
        uVar6 = (ulong)uVar1;
        cVar4 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar4 != '\0');
      uVar6 = (ulong)(uVar1 % 0xb2);
    }
    for (pDVar5 = tags->hashtab[uVar6]; (pDVar5 != (DictHash *)0x0 && (pDVar5->tag != (Dict *)0x0));
        pDVar5 = pDVar5->next) {
      iVar2 = prvTidytmbstrcmp(s,pDVar5->tag->name);
      if (iVar2 == 0) {
        return pDVar5->tag;
      }
    }
    old = (Dict *)(*in_FS_OFFSET + -0x2640);
    uVar6 = 0;
    do {
      iVar2 = prvTidytmbstrcmp(s,old->name);
      if (iVar2 == 0) goto LAB_00141d2a;
      old = old + 1;
      uVar6 = uVar6 + 0x40;
    } while (uVar6 < 0x2600);
    for (old = tags->declared_tag_list; old != (Dict *)0x0; old = old->next) {
      iVar2 = prvTidytmbstrcmp(s,old->name);
      if (iVar2 == 0) {
LAB_00141d2a:
        tagsInstall(doc,tags,old);
        return old;
      }
    }
  }
  return (Dict *)0x0;
}

Assistant:

static const Dict* tagsLookup( TidyDocImpl* doc, TidyTagImpl* tags, ctmbstr s )
{
    const Dict *np;
    const DictHash* p;

    if (!s)
        return NULL;

    /* this breaks if declared elements get changed between two   */
    /* parser runs since Tidy would use the cached version rather */
    /* than the new one.                                          */
    /* However, as FreeDeclaredTags() correctly cleans the hash   */
    /* this should not be true anymore.                           */
    for (p = tags->hashtab[tagsHash(s)]; p && p->tag; p = p->next)
        if (TY_(tmbstrcmp)(s, p->tag->name) == 0)
            return p->tag;

    for (np = tag_defs + 1; np < tag_defs + N_TIDY_TAGS; ++np)
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return tagsInstall(doc, tags, np);

    for (np = tags->declared_tag_list; np; np = np->next)
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return tagsInstall(doc, tags, np);

    return NULL;
}